

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

lys_module * ly_ctx_get_module_latest_by(ly_ctx *ctx,char *key,size_t key_offset)

{
  uint uVar1;
  lyd_node **pplVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  lys_module *plVar6;
  
  uVar1 = (ctx->list).count;
  uVar4 = 0;
  do {
    if (uVar4 < uVar1) {
      uVar5 = (ulong)uVar4;
      pplVar2 = (ctx->list).field_2.dnodes;
      do {
        plVar6 = (lys_module *)pplVar2[uVar5];
        iVar3 = strcmp(key,*(char **)((long)&plVar6->ctx + key_offset));
        if (iVar3 == 0) {
          uVar4 = (int)uVar5 + 1;
          goto LAB_0011cf03;
        }
        uVar5 = uVar5 + 1;
        uVar4 = uVar1;
      } while (uVar1 != uVar5);
    }
    plVar6 = (lys_module *)0x0;
LAB_0011cf03:
    if (plVar6 == (lys_module *)0x0) {
      return (lys_module *)0x0;
    }
    if ((plVar6->latest_revision & 1) != 0) {
      return plVar6;
    }
  } while( true );
}

Assistant:

static struct lys_module *
ly_ctx_get_module_latest_by(const struct ly_ctx *ctx, const char *key, size_t key_offset)
{
    struct lys_module *mod;
    uint32_t index = 0;

    while ((mod = ly_ctx_get_module_by_iter(ctx, key, 0, key_offset, &index))) {
        if (mod->latest_revision & LYS_MOD_LATEST_REV) {
            return mod;
        }
    }

    return NULL;
}